

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

void __thiscall
psy::C::Lexer::lexIntegerOrFloating_AtFollowOfSuffix
          (Lexer *this,SyntaxToken *tk,function<void_()> *makeLexeme)

{
  int iVar1;
  bool bVar2;
  function<void_()> *makeLexeme_local;
  SyntaxToken *tk_local;
  Lexer *this_local;
  
  iVar1 = isalnum((uint)this->yychar_);
  if ((iVar1 == 0) && (this->yychar_ != '_')) {
    std::function<void_()>::operator()(makeLexeme);
  }
  else {
    tk->syntaxK_ = Error;
    do {
      yyinput(this);
      iVar1 = isalnum((uint)this->yychar_);
      bVar2 = true;
      if (iVar1 == 0) {
        bVar2 = this->yychar_ == '_';
      }
    } while (bVar2);
  }
  return;
}

Assistant:

void Lexer::lexIntegerOrFloating_AtFollowOfSuffix(SyntaxToken* tk,
                                                  std::function<void ()> makeLexeme)
{
    if (std::isalnum(yychar_) || yychar_ == '_') {
        tk->syntaxK_ = SyntaxKind::Error;
        do {
            yyinput();
        }
        while (std::isalnum(yychar_) || yychar_ == '_');
        return;
    }

    makeLexeme();
}